

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.c
# Opt level: O0

int assert_match(char *pattern,char *subject,int expected)

{
  FILE *__stream;
  char *pcVar1;
  int local_28;
  int ret;
  int expected_local;
  char *subject_local;
  char *pattern_local;
  
  local_28 = try_match(pattern,subject);
  __stream = _stderr;
  if (local_28 == expected) {
    pattern_local._4_4_ = 0;
  }
  else {
    if (local_28 == 0) {
      fprintf(_stderr,"Error: Regex \'%s\' was expected to match subject \'%s\', but did not\n",
              pattern,subject);
      local_28 = -0x16;
    }
    else if (local_28 == 1) {
      fprintf(_stderr,"Error: Regex \'%s\' was not expected to match subject \'%s\', but did\n",
              pattern,subject);
      local_28 = -0x16;
    }
    else {
      pcVar1 = strerror(-local_28);
      fprintf(__stream,
              "Error: Failure while attempting to match regex \'%s\' to subject \'%s\' (%d): %s\n",
              pattern,subject,(ulong)(uint)-local_28,pcVar1);
    }
    pattern_local._4_4_ = local_28;
  }
  return pattern_local._4_4_;
}

Assistant:

static int assert_match(const char * const pattern, const char * const subject,
			int expected)
{
	int ret = try_match(pattern, subject);

	if (ret != expected) {
		switch (ret) {
		case 1:
			fprintf(stderr,
				"Error: Regex '%s' was not expected to match subject '%s', but did\n",
				pattern, subject);
			ret = -EINVAL;
			break;
		case 0:
			fprintf(stderr,
				"Error: Regex '%s' was expected to match subject '%s', but did not\n",
				pattern, subject);
			ret = -EINVAL;
			break;
		default:
			fprintf(stderr,
				"Error: Failure while attempting to match regex '%s' to subject '%s' (%d): %s\n",
				pattern, subject, -ret, strerror(-ret));
			break;
		}

		return ret;
	}

	return 0;
}